

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void examine_app14(j_decompress_ptr cinfo,JOCTET *data,uint datalen,JLONG remaining)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  int in_ECX;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  int *_mp;
  uint transform;
  uint flags1;
  uint flags0;
  uint version;
  
  if ((((in_EDX < 0xc) || (*in_RSI != 'A')) || (in_RSI[1] != 'd')) ||
     (((in_RSI[2] != 'o' || (in_RSI[3] != 'b')) || (in_RSI[4] != 'e')))) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x4e;
    *(uint *)(*in_RDI + 0x2c) = in_EDX + in_ECX;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
  }
  else {
    bVar1 = in_RSI[7];
    bVar2 = in_RSI[8];
    bVar3 = in_RSI[9];
    bVar4 = in_RSI[10];
    bVar5 = in_RSI[0xb];
    lVar6 = *in_RDI;
    *(uint *)(lVar6 + 0x2c) = (uint)(byte)in_RSI[5] * 0x100 + (uint)(byte)in_RSI[6];
    *(uint *)(lVar6 + 0x30) = (uint)bVar1 * 0x100 + (uint)bVar2;
    *(uint *)(lVar6 + 0x34) = (uint)bVar3 * 0x100 + (uint)bVar4;
    *(uint *)(lVar6 + 0x38) = (uint)bVar5;
    *(undefined4 *)(*in_RDI + 0x28) = 0x4c;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
    *(undefined4 *)(in_RDI + 0x30) = 1;
    *(byte *)((long)in_RDI + 0x184) = bVar5;
  }
  return;
}

Assistant:

LOCAL(void)
examine_app14(j_decompress_ptr cinfo, JOCTET *data, unsigned int datalen,
              JLONG remaining)
/* Examine first few bytes from an APP14.
 * Take appropriate action if it is an Adobe marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  unsigned int version, flags0, flags1, transform;

  if (datalen >= APP14_DATA_LEN &&
      data[0] == 0x41 &&
      data[1] == 0x64 &&
      data[2] == 0x6F &&
      data[3] == 0x62 &&
      data[4] == 0x65) {
    /* Found Adobe APP14 marker */
    version = (data[5] << 8) + data[6];
    flags0 = (data[7] << 8) + data[8];
    flags1 = (data[9] << 8) + data[10];
    transform = data[11];
    TRACEMS4(cinfo, 1, JTRC_ADOBE, version, flags0, flags1, transform);
    cinfo->saw_Adobe_marker = TRUE;
    cinfo->Adobe_transform = (UINT8)transform;
  } else {
    /* Start of APP14 does not match "Adobe", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP14, (int)(datalen + remaining));
  }
}